

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::PushLine(Hunk *this,char edit,char *line)

{
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *this_00;
  int iVar1;
  undefined7 in_register_00000031;
  value_type local_20;
  
  iVar1 = (int)CONCAT71(in_register_00000031,edit);
  if (iVar1 == 0x2d) {
    this->removes_ = this->removes_ + 1;
    this_00 = &this->hunk_removes_;
    local_20.first = '-';
  }
  else if (iVar1 == 0x2b) {
    this->adds_ = this->adds_ + 1;
    this_00 = &this->hunk_adds_;
    local_20.first = '+';
  }
  else {
    if (iVar1 != 0x20) {
      return;
    }
    this->common_ = this->common_ + 1;
    FlushEdits(this);
    this_00 = &this->hunk_;
    local_20.first = ' ';
  }
  local_20.second = line;
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::push_back(this_00,&local_20);
  return;
}

Assistant:

void PushLine(char edit, const char* line) {
    switch (edit) {
      case ' ':
        ++common_;
        FlushEdits();
        hunk_.push_back(std::make_pair(' ', line));
        break;
      case '-':
        ++removes_;
        hunk_removes_.push_back(std::make_pair('-', line));
        break;
      case '+':
        ++adds_;
        hunk_adds_.push_back(std::make_pair('+', line));
        break;
    }
  }